

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O3

void __thiscall tonk::BandwidthShape::Compress(BandwidthShape *this,uint8_t *buffer)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint8_t uVar3;
  uint uVar4;
  undefined2 uVar5;
  
  if (0.01 < this->FECRate) {
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x44000000),0),ZEXT416((uint)(this->FECRate + -0.01)),
                             ZEXT416(0x3f000000));
    uVar4 = (uint)auVar1._0_4_;
    if (0 < (int)uVar4) {
      if (0xfe < uVar4) {
        uVar4 = 0xff;
      }
      uVar3 = (uint8_t)uVar4;
      goto LAB_00114dbe;
    }
  }
  uVar3 = '\0';
LAB_00114dbe:
  uVar4 = this->AppBPS;
  if (uVar4 == 0) {
    uVar5 = 0;
  }
  else {
    uVar2 = (0x15U - LZCOUNT(uVar4)) * 0x800 | uVar4 >> (0x15U - LZCOUNT(uVar4) & 0x1f);
    if (uVar4 < 0x800) {
      uVar2 = uVar4;
    }
    uVar5 = (undefined2)uVar2;
  }
  *(undefined2 *)buffer = uVar5;
  buffer[2] = uVar3;
  return;
}

Assistant:

void BandwidthShape::Compress(uint8_t* buffer) const
{
    uint8_t fecRateByte = FECRateToByte(FECRate);

    const uint32_t dwordAppBPS = (uint32_t)AppBPS;
    TONK_DEBUG_ASSERT(dwordAppBPS >= protocol::kMinimumBytesPerSecond);

    const uint16_t wordAppBPS = FixedPointCompress32to16(dwordAppBPS);

    siamese::WriteU16_LE(buffer, wordAppBPS);
    buffer[2] = fecRateByte;
}